

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_objects.cpp
# Opt level: O0

void __thiscall
ear::GainCalculatorObjectsImpl::GainCalculatorObjectsImpl
          (GainCalculatorObjectsImpl *this,Layout *layout)

{
  element_type *peVar1;
  int local_c4;
  vector<bool,_std::allocator<bool>_> local_c0;
  Layout local_88;
  Layout *local_18;
  Layout *layout_local;
  GainCalculatorObjectsImpl *this_local;
  
  local_18 = layout;
  layout_local = &this->_layout;
  Layout::Layout(&this->_layout,layout);
  Layout::withoutLfe(&local_88,&this->_layout);
  configurePolarPanner((ear *)&this->_pointSourcePanner,&local_88);
  Layout::~Layout(&local_88);
  PolarExtent::PolarExtent(&this->_polarExtentPanner,&this->_pointSourcePanner);
  Layout::isLfe(&local_c0,local_18);
  copy_vector<Eigen::Array<bool,__1,_1,_0,__1,_1>,_std::vector<bool,_std::allocator<bool>_>,_0>
            ((ear *)&this->_isLfe,&local_c0);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_c0);
  peVar1 = std::
           __shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_pointSourcePanner);
  local_c4 = (*peVar1->_vptr_PointSourcePanner[1])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->_pvTmp,&local_c4);
  return;
}

Assistant:

GainCalculatorObjectsImpl::GainCalculatorObjectsImpl(const Layout& layout)
      : _layout(layout),
        _pointSourcePanner(configurePolarPanner(_layout.withoutLfe())),
        _polarExtentPanner(_pointSourcePanner),
        _isLfe(copy_vector<decltype(_isLfe)>(layout.isLfe())),
        _pvTmp(_pointSourcePanner->numberOfOutputChannels()){}